

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Addition.h
# Opt level: O1

ptr<Value> __thiscall
Addition::asIntegers(Addition *this,longlong leftOperand,longlong rightOperand)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var1;
  long in_RCX;
  ptr<Value> pVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_0012f548;
  pp_Var1[2] = (_func_int *)&PTR__Member_0012f598;
  pp_Var1[3] = (_func_int *)(rightOperand + in_RCX);
  (this->super_Operation)._vptr_Operation = pp_Var1 + 2;
  this[1].super_Operation._vptr_Operation = pp_Var1;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Member_0012f598;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asIntegers(long long leftOperand, long long rightOperand) override {
        return make<Integer>(leftOperand + rightOperand);
    }